

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# res012.c
# Opt level: O0

vorbis_info_residue * res0_unpack(vorbis_info *vi,oggpack_buffer *opb)

{
  void *pvVar1;
  int iVar2;
  long lVar3;
  uint local_3c;
  int cascade;
  codec_setup_info *ci;
  vorbis_info_residue0 *info;
  int acc;
  int j;
  oggpack_buffer *opb_local;
  vorbis_info *vi_local;
  
  info._0_4_ = 0;
  vi_local = (vorbis_info *)calloc(1,0x520);
  pvVar1 = vi->codec_setup;
  lVar3 = oggpack_read(opb,0x18);
  vi_local->version = (int)lVar3;
  vi_local->channels = (int)((ulong)lVar3 >> 0x20);
  lVar3 = oggpack_read(opb,0x18);
  vi_local->rate = lVar3;
  lVar3 = oggpack_read(opb,0x18);
  *(int *)&vi_local->bitrate_upper = (int)lVar3 + 1;
  lVar3 = oggpack_read(opb,6);
  *(int *)((long)&vi_local->bitrate_upper + 4) = (int)lVar3 + 1;
  lVar3 = oggpack_read(opb,8);
  *(int *)&vi_local->bitrate_nominal = (int)lVar3;
  for (info._4_4_ = 0; info._4_4_ < *(int *)((long)&vi_local->bitrate_upper + 4);
      info._4_4_ = info._4_4_ + 1) {
    lVar3 = oggpack_read(opb,3);
    local_3c = (uint)lVar3;
    lVar3 = oggpack_read(opb,1);
    if (lVar3 != 0) {
      lVar3 = oggpack_read(opb,5);
      local_3c = local_3c | (uint)(lVar3 << 3);
    }
    *(uint *)((long)&vi_local->bitrate_nominal + (long)info._4_4_ * 4 + 4) = local_3c;
    iVar2 = icount(local_3c);
    info._0_4_ = iVar2 + (int)info;
  }
  for (info._4_4_ = 0; info._4_4_ < (int)info; info._4_4_ = info._4_4_ + 1) {
    lVar3 = oggpack_read(opb,8);
    (&vi_local[5].channels)[info._4_4_] = (int)lVar3;
  }
  if ((int)vi_local->bitrate_nominal < *(int *)((long)pvVar1 + 0x24)) {
    for (info._4_4_ = 0; info._4_4_ < (int)info; info._4_4_ = info._4_4_ + 1) {
      if (*(int *)((long)pvVar1 + 0x24) <= (&vi_local[5].channels)[info._4_4_]) goto LAB_0012f25e;
    }
  }
  else {
LAB_0012f25e:
    res0_free_info(vi_local);
    vi_local = (vorbis_info *)0x0;
  }
  return vi_local;
}

Assistant:

vorbis_info_residue *res0_unpack(vorbis_info *vi,oggpack_buffer *opb){
  int j,acc=0;
  vorbis_info_residue0 *info=(vorbis_info_residue0 *)_ogg_calloc(1,sizeof(*info));
  codec_setup_info     *ci=(codec_setup_info *)vi->codec_setup;

  info->begin=oggpack_read(opb,24);
  info->end=oggpack_read(opb,24);
  info->grouping=oggpack_read(opb,24)+1;
  info->partitions=oggpack_read(opb,6)+1;
  info->groupbook=oggpack_read(opb,8);

  for(j=0;j<info->partitions;j++){
    int cascade=oggpack_read(opb,3);
    if(oggpack_read(opb,1))
      cascade|=(oggpack_read(opb,5)<<3);
    info->secondstages[j]=cascade;

    acc+=icount(cascade);
  }
  for(j=0;j<acc;j++)
    info->booklist[j]=oggpack_read(opb,8);

  if(info->groupbook>=ci->books)goto errout;
  for(j=0;j<acc;j++)
    if(info->booklist[j]>=ci->books)goto errout;

  return(info);
 errout:
  res0_free_info(info);
  return(NULL);
}